

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Marshal.c
# Opt level: O0

TPM_RC TPM2B_NAME_Unmarshal(TPM2B_NAME *target,BYTE **buffer,INT32 *size)

{
  TPM_RC result;
  INT32 *size_local;
  BYTE **buffer_local;
  TPM2B_NAME *target_local;
  
  target_local._4_4_ = UINT16_Unmarshal((UINT16 *)target,buffer,size);
  if (target_local._4_4_ == 0) {
    if ((target->t).size < 0x45) {
      target_local._4_4_ = BYTE_Array_Unmarshal((target->t).name,buffer,size,(uint)(target->t).size)
      ;
    }
    else {
      target_local._4_4_ = 0x95;
    }
  }
  return target_local._4_4_;
}

Assistant:

TPM_RC
TPM2B_NAME_Unmarshal(TPM2B_NAME *target, BYTE **buffer, INT32 *size)
{
    TPM_RC    result;
    result = UINT16_Unmarshal((UINT16 *)&(target->t.size), buffer, size);
    if(result != TPM_RC_SUCCESS)
        return result;
    if((target->t.size) > sizeof(TPMU_NAME))
        return TPM_RC_SIZE;
    result = BYTE_Array_Unmarshal((BYTE *)(target->t.name), buffer, size, (INT32)(target->t.size));
    return result;
}